

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

isoent * isoent_create_virtual_dir(archive_write *a,iso9660_conflict *iso9660,char *pathname)

{
  __uid_t _Var1;
  __gid_t _Var2;
  int iVar3;
  isofile *file_00;
  iso9660_conflict *in_RSI;
  isoent *isoent;
  isofile *file;
  isofile *in_stack_00000060;
  archive_write *in_stack_00000068;
  isofile *in_stack_ffffffffffffffb8;
  archive_entry *in_stack_ffffffffffffffc0;
  archive_entry *entry;
  archive_write *in_stack_ffffffffffffffc8;
  archive_entry *entry_00;
  isoent *local_8;
  
  file_00 = isofile_new(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (file_00 == (isofile *)0x0) {
    local_8 = (isoent *)0x0;
  }
  else {
    archive_entry_set_pathname(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    archive_entry_unset_mtime((archive_entry *)0x17244d);
    archive_entry_unset_atime((archive_entry *)0x17245b);
    archive_entry_unset_ctime((archive_entry *)0x172469);
    entry = file_00->entry;
    _Var1 = getuid();
    archive_entry_set_uid(entry,(ulong)_Var1);
    entry_00 = file_00->entry;
    _Var2 = getgid();
    archive_entry_set_gid(entry_00,(ulong)_Var2);
    archive_entry_set_mode(file_00->entry,0x416d);
    archive_entry_set_nlink(file_00->entry,2);
    iVar3 = isofile_gen_utility_names(in_stack_00000068,in_stack_00000060);
    if (iVar3 < -0x14) {
      isofile_free((isofile *)entry);
      local_8 = (isoent *)0x0;
    }
    else {
      isofile_add_entry(in_RSI,file_00);
      local_8 = isoent_new(in_stack_ffffffffffffffb8);
      if (local_8 == (isoent *)0x0) {
        local_8 = (isoent *)0x0;
      }
      else {
        local_8->field_0xe8 = local_8->field_0xe8 & 0xfd | 2;
        local_8->field_0xe8 = local_8->field_0xe8 & 0xfe | 1;
      }
    }
  }
  return local_8;
}

Assistant:

static struct isoent *
isoent_create_virtual_dir(struct archive_write *a, struct iso9660 *iso9660, const char *pathname)
{
	struct isofile *file;
	struct isoent *isoent;

	file = isofile_new(a, NULL);
	if (file == NULL)
		return (NULL);
	archive_entry_set_pathname(file->entry, pathname);
	archive_entry_unset_mtime(file->entry);
	archive_entry_unset_atime(file->entry);
	archive_entry_unset_ctime(file->entry);
	archive_entry_set_uid(file->entry, getuid());
	archive_entry_set_gid(file->entry, getgid());
	archive_entry_set_mode(file->entry, 0555 | AE_IFDIR);
	archive_entry_set_nlink(file->entry, 2);
	if (isofile_gen_utility_names(a, file) < ARCHIVE_WARN) {
		isofile_free(file);
		return (NULL);
	}
	isofile_add_entry(iso9660, file);

	isoent = isoent_new(file);
	if (isoent == NULL)
		return (NULL);
	isoent->dir = 1;
	isoent->virtual = 1;

	return (isoent);
}